

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O0

int CheckBig(void)

{
  int iVar1;
  char *pcVar2;
  uint local_38;
  uint local_34;
  uint b;
  uint a;
  uint i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  int passed;
  FILE *out;
  
  _i = fopen("out.txt","r");
  n = 1;
  if (_i == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    testN = testN + 1;
    out._4_4_ = -1;
  }
  else {
    for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
      pcVar2 = ScanInt((FILE *)_i,&n_1);
      if ((pcVar2 != "PASSED") || (n_1 != 0)) {
        n = 0;
        printf("wrong output -- ");
        break;
      }
    }
    for (i_2 = 1; (int)i_2 < 5; i_2 = i_2 + 1) {
      pcVar2 = ScanInt((FILE *)_i,(int *)&a);
      if ((pcVar2 != "PASSED") || (a != i_2)) {
        n = 0;
        printf("wrong output -- ");
        break;
      }
    }
    if (n != 0) {
      for (b = 0; b < 0xffffff; b = b + 1) {
        pcVar2 = ScanUintUint((FILE *)_i,&local_34,&local_38);
        if (((pcVar2 != "PASSED") || (local_34 != b * 4 + 1)) || (local_38 != 8)) {
          n = 0;
          printf("wrong output -- ");
          break;
        }
      }
    }
    if (n != 0) {
      iVar1 = HaveGarbageAtTheEnd((FILE *)_i);
      n = (int)((iVar1 != 0 ^ 0xffU) & 1);
    }
    fclose(_i);
    if (n == 0) {
      printf("FAILED\n");
      testN = testN + 1;
      out._4_4_ = 1;
    }
    else {
      printf("PASSED\n");
      testN = testN + 1;
      out._4_4_ = 0;
    }
  }
  return out._4_4_;
}

Assistant:

static int CheckBig(void) {
    FILE *const out = fopen("out.txt", "r");
    int passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        ++testN;
        return -1;
    }

    for (int i = 0; i < 4; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || n != 0) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }

    for (int i = 1; i < 5; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || n != i) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }

    if (passed) {
        for (unsigned int i = 0; i < 1024 * 1024 * 8 * 2 - 1; ++i) {
            unsigned int a, b;
            if (ScanUintUint(out, &a, &b) != Pass || a != 1 + i * 4 || b != 8) {
                passed = 0;
                printf("wrong output -- ");
                break;
            }
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        ++testN;
        return 0;
    } else {
        printf("FAILED\n");
       ++testN;
        return 1;
    }
}